

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void read_message_from_console(void)

{
  _Rb_tree_node_base *p_Var1;
  allocator aStack_186d9;
  string asStack_186d8 [32];
  char message [100000];
  
  fgets(message,100000,_stdin);
  std::__cxx11::string::string(asStack_186d8,message,&aStack_186d9);
  std::__cxx11::string::operator=((string *)&tosend_message_abi_cxx11_,asStack_186d8);
  std::__cxx11::string::~string(asStack_186d8);
  fprintf(_stderr,"Input from console: %s\n",message);
  p_Var1 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (flag_root == false) {
    create_new_message(1,id_parent);
    p_Var1 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  for (; (_Rb_tree_header *)p_Var1 != &children._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    create_new_message(1,p_Var1[1]._M_color);
  }
  return;
}

Assistant:

void read_message_from_console() {
    char message[MESSAGE_MAX_SIZE];
    fgets(message, MESSAGE_MAX_SIZE, stdin);
    tosend_message = std::string(message);
    fprintf(stderr, "Input from console: %s\n", message);

    if (!flag_root) {
        create_new_message(MSG, id_parent);
    }
    for (auto ch : children) {
        create_new_message(MSG, ch);
    }
}